

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::operator()(arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
             *this,basic_string_view<char> value)

{
  ostream_type *poVar1;
  char *pcVar2;
  void *in_RCX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar3;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *this_00;
  iterator iVar4;
  basic_string_view<char> s;
  error_handler local_21;
  
  this_00 = (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
             *)value.data_;
  poVar1 = this_00[1].out_._M_stream;
  if (poVar1 == (ostream_type *)0x0) {
    basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::write(this_00,(int)value.size_,in_RCX,(size_t)in_RCX);
    pcVar3 = extraout_RDX_00;
  }
  else {
    check_string_type_spec<char,fmt::v5::internal::error_handler>((char)poVar1[0x11],&local_21);
    s.size_ = (size_t)in_RCX;
    s.data_ = (char *)value.size_;
    basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::write<char>(this_00,s,(format_specs *)this_00[1].out_._M_stream);
    pcVar3 = extraout_RDX;
  }
  pcVar2 = (this_00->out_)._M_string;
  (this->writer_).out_._M_stream = (this_00->out_)._M_stream;
  (this->writer_).out_._M_string = pcVar2;
  iVar4._M_string = pcVar3;
  iVar4._M_stream = (ostream_type *)this;
  return iVar4;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }